

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adfa.h
# Opt level: O2

void __thiscall re2c::State::State(State *this)

{
  label_t lVar1;
  
  lVar1 = label_t::first();
  (this->label).value = lVar1.value;
  this->rule = (RuleOp *)0x0;
  this->next = (State *)0x0;
  *(undefined8 *)((long)&this->next + 2) = 0;
  *(undefined8 *)((long)&this->fill + 2) = 0;
  Go::Go(&this->go);
  (this->action).type = MATCH;
  (this->action).info.initial = (Initial *)0x0;
  return;
}

Assistant:

State ()
		: label (label_t::first ())
		, rule (NULL)
		, next (0)
		, fill (0)
		, isPreCtxt (false)
		, isBase (false)
		, go ()
		, action ()
	{}